

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::FileOptions::InternalSerializeWithCachedSizesToArray
          (FileOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int32 value;
  int iVar3;
  UninterpretedOption *this_00;
  void *pvVar4;
  uint8 *target_00;
  int iVar5;
  uint8 *local_38;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  local_38 = target;
  if ((uVar2 & 1) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,1,(this->java_package_).ptr_,target);
  }
  if ((uVar2 & 2) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,8,(this->java_outer_classname_).ptr_,local_38);
  }
  if ((uVar2 >> 0x13 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    value = this->optimize_for_;
    *local_38 = 'H';
    local_38 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,local_38 + 1);
  }
  if ((uVar2 >> 10 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->java_multiple_files_;
    *local_38 = 'P';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 1);
  }
  if ((uVar2 & 4) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0xb,(this->go_package_).ptr_,local_38);
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->cc_generic_services_;
    local_38[0] = 0x80;
    local_38[1] = '\x01';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->java_generic_services_;
    local_38[0] = 0x88;
    local_38[1] = '\x01';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((short)uVar2 < 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->py_generic_services_;
    local_38[0] = 0x90;
    local_38[1] = '\x01';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->java_generate_equals_and_hash_;
    local_38[0] = 0xa0;
    local_38[1] = '\x01';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 >> 0x11 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->deprecated_;
    local_38[0] = 0xb8;
    local_38[1] = '\x01';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->java_string_check_utf8_;
    local_38[0] = 0xd8;
    local_38[1] = '\x01';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 >> 0x12 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->cc_enable_arenas_;
    local_38[0] = 0xf8;
    local_38[1] = '\x01';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 & 8) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x24,(this->objc_class_prefix_).ptr_,local_38);
  }
  if ((uVar2 & 0x10) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x25,(this->csharp_namespace_).ptr_,local_38);
  }
  if ((uVar2 & 0x20) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x27,(this->swift_prefix_).ptr_,local_38);
  }
  if ((uVar2 & 0x40) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x28,(this->php_class_prefix_).ptr_,local_38);
  }
  if ((char)uVar2 < '\0') {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x29,(this->php_namespace_).ptr_,local_38);
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    bVar1 = this->php_generic_services_;
    local_38[0] = 0xd0;
    local_38[1] = '\x02';
    local_38 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_38 + 2);
  }
  if ((uVar2 >> 8 & 1) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x2c,(this->php_metadata_namespace_).ptr_,local_38);
  }
  if ((uVar2 >> 9 & 1) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,0x2d,(this->ruby_package_).ptr_,local_38);
  }
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar3 != iVar5; iVar5 = iVar5 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    this_00 = (UninterpretedOption *)
              ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_)->elements[iVar5];
    local_38[0] = 0xba;
    local_38[1] = '>';
    target_00 = io::CodedOutputStream::WriteVarint32ToArray
                          ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_38 + 2
                          );
    local_38 = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                         (this_00,target_00,stream);
  }
  local_38 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                       (&this->_extensions_,1000,0x20000000,local_38,stream);
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    local_38 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),local_38,stream);
  }
  return local_38;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string java_package = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_java_package().data(), static_cast<int>(this->_internal_java_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_package");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_java_package(), target);
  }

  // optional string java_outer_classname = 8;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_java_outer_classname().data(), static_cast<int>(this->_internal_java_outer_classname().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_outer_classname");
    target = stream->WriteStringMaybeAliased(
        8, this->_internal_java_outer_classname(), target);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (cached_has_bits & 0x00080000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      9, this->_internal_optimize_for(), target);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (cached_has_bits & 0x00000400u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(10, this->_internal_java_multiple_files(), target);
  }

  // optional string go_package = 11;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_go_package().data(), static_cast<int>(this->_internal_go_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.go_package");
    target = stream->WriteStringMaybeAliased(
        11, this->_internal_go_package(), target);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (cached_has_bits & 0x00002000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(16, this->_internal_cc_generic_services(), target);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (cached_has_bits & 0x00004000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(17, this->_internal_java_generic_services(), target);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (cached_has_bits & 0x00008000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(18, this->_internal_py_generic_services(), target);
  }

  // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
  if (cached_has_bits & 0x00000800u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(20, this->_internal_java_generate_equals_and_hash(), target);
  }

  // optional bool deprecated = 23 [default = false];
  if (cached_has_bits & 0x00020000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(23, this->_internal_deprecated(), target);
  }

  // optional bool java_string_check_utf8 = 27 [default = false];
  if (cached_has_bits & 0x00001000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(27, this->_internal_java_string_check_utf8(), target);
  }

  // optional bool cc_enable_arenas = 31 [default = false];
  if (cached_has_bits & 0x00040000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(31, this->_internal_cc_enable_arenas(), target);
  }

  // optional string objc_class_prefix = 36;
  if (cached_has_bits & 0x00000008u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_objc_class_prefix().data(), static_cast<int>(this->_internal_objc_class_prefix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.objc_class_prefix");
    target = stream->WriteStringMaybeAliased(
        36, this->_internal_objc_class_prefix(), target);
  }

  // optional string csharp_namespace = 37;
  if (cached_has_bits & 0x00000010u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_csharp_namespace().data(), static_cast<int>(this->_internal_csharp_namespace().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.csharp_namespace");
    target = stream->WriteStringMaybeAliased(
        37, this->_internal_csharp_namespace(), target);
  }

  // optional string swift_prefix = 39;
  if (cached_has_bits & 0x00000020u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_swift_prefix().data(), static_cast<int>(this->_internal_swift_prefix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.swift_prefix");
    target = stream->WriteStringMaybeAliased(
        39, this->_internal_swift_prefix(), target);
  }

  // optional string php_class_prefix = 40;
  if (cached_has_bits & 0x00000040u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_php_class_prefix().data(), static_cast<int>(this->_internal_php_class_prefix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_class_prefix");
    target = stream->WriteStringMaybeAliased(
        40, this->_internal_php_class_prefix(), target);
  }

  // optional string php_namespace = 41;
  if (cached_has_bits & 0x00000080u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_php_namespace().data(), static_cast<int>(this->_internal_php_namespace().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_namespace");
    target = stream->WriteStringMaybeAliased(
        41, this->_internal_php_namespace(), target);
  }

  // optional bool php_generic_services = 42 [default = false];
  if (cached_has_bits & 0x00010000u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(42, this->_internal_php_generic_services(), target);
  }

  // optional string php_metadata_namespace = 44;
  if (cached_has_bits & 0x00000100u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_php_metadata_namespace().data(), static_cast<int>(this->_internal_php_metadata_namespace().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_metadata_namespace");
    target = stream->WriteStringMaybeAliased(
        44, this->_internal_php_metadata_namespace(), target);
  }

  // optional string ruby_package = 45;
  if (cached_has_bits & 0x00000200u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_ruby_package().data(), static_cast<int>(this->_internal_ruby_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.ruby_package");
    target = stream->WriteStringMaybeAliased(
        45, this->_internal_ruby_package(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileOptions)
  return target;
}